

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O0

PAL_ERROR PAL_Enter(PAL_Boundary boundary)

{
  CPalThread *local_18;
  CPalThread *pThread;
  PAL_ERROR palError;
  PAL_Boundary boundary_local;
  
  pThread._4_4_ = boundary;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread._0_4_ = 0;
  local_18 = CorUnix::InternalGetCurrentThread();
  if (local_18 == (CPalThread *)0x0) {
    if (pThread._4_4_ != PAL_BoundaryTop) {
      fprintf(_stderr,"] %s %s:%d","PAL_Enter",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
              ,0x41);
      fprintf(_stderr,
              "Expression: PAL_BoundaryTop == boundary, Description: How are we entering a PAL thread for the first time not from the top? (boundary=%u)"
              ,(ulong)pThread._4_4_);
    }
    pThread._0_4_ = AllocatePalThread(&local_18);
    if (((PAL_ERROR)pThread != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
      abort();
    }
  }
  else {
    pThread._0_4_ = CorUnix::CPalThread::Enter(local_18,pThread._4_4_);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return (PAL_ERROR)pThread;
  }
  abort();
}

Assistant:

PAL_ERROR
PALAPI
PAL_Enter(PAL_Boundary boundary)
{
    ENTRY_EXTERNAL("PAL_Enter(boundary=%u)\n", boundary);

    PAL_ERROR palError = ERROR_SUCCESS;
    CPalThread *pThread = InternalGetCurrentThread();
    if (pThread != NULL)
    {
        palError = pThread->Enter(boundary);
    }
    else
    {
        // If this assert fires, we'll have to pipe this information so that
        // CPalThread's RunPostCreateInitializers call to SEHEnable
        // can know what direction.
        _ASSERT_MSG(PAL_BoundaryTop == boundary, "How are we entering a PAL "
            "thread for the first time not from the top? (boundary=%u)", boundary);

        palError = AllocatePalThread(&pThread);
        if (NO_ERROR != palError)
        {
            ERROR("Unable to allocate pal thread: error %d\n", palError);
        }
    }

    LOGEXIT("PAL_Enter returns %d\n", palError);
    return palError;
}